

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O2

int funchook_install(funchook_t *funchook,int flags)

{
  undefined4 *puVar1;
  uint uVar2;
  ulong uVar3;
  funchook_entry_t *pfVar4;
  funchook_page_t *page;
  mem_state_t local_40;
  
  funchook_log(funchook,"Enter funchook_install(%p, 0x%x)\n",funchook,flags);
  if (funchook->installed == 0) {
    page = (funchook_page_t *)&funchook->page_list;
    while (page = page->next, page != (funchook_page_t *)0x0) {
      uVar2 = funchook_page_protect(funchook,page);
      if (uVar2 != 0) goto LAB_001016c3;
      pfVar4 = page->entries;
      for (uVar3 = 0; uVar3 < page->used; uVar3 = uVar3 + 1) {
        uVar2 = funchook_unprotect_begin(funchook,&local_40,pfVar4->target_func,5);
        if (uVar2 != 0) goto LAB_001016c3;
        puVar1 = (undefined4 *)pfVar4->target_func;
        *(uint8_t *)(puVar1 + 1) = pfVar4->new_code[4];
        *puVar1 = *(undefined4 *)pfVar4->new_code;
        uVar2 = funchook_unprotect_end(funchook,&local_40);
        if (uVar2 != 0) goto LAB_001016c3;
        pfVar4 = pfVar4 + 1;
      }
    }
    funchook->installed = 1;
    uVar2 = 0;
  }
  else {
    uVar2 = 2;
  }
LAB_001016c3:
  funchook_log_end(funchook,"Leave funchook_install() => %d\n",(ulong)uVar2);
  return uVar2;
}

Assistant:

int funchook_install(funchook_t *funchook, int flags)
{
    int rv;

    funchook_log(funchook, "Enter funchook_install(%p, 0x%x)\n", funchook, flags);
    rv = funchook_install_internal(funchook, flags);
    funchook_log_end(funchook, "Leave funchook_install() => %d\n", rv);
    return rv;
}